

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O2

USTATUS __thiscall
FfsParser::parseBpdtRegion
          (FfsParser *this,UByteArray *region,UINT32 localOffset,UINT32 sbpdtOffsetFixup,
          UModelIndex *parent,UModelIndex *index)

{
  uint *bytes;
  UINT32 UVar1;
  UINT32 UVar2;
  pointer pcVar3;
  TreeModel *pTVar4;
  UINT8 UVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  char *pcVar9;
  USTATUS UVar10;
  size_t i;
  long lVar11;
  ulong uVar12;
  pointer pBVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_> partitions;
  UByteArray signature;
  UModelIndex entryIndex;
  UByteArray partition;
  undefined1 local_258 [16];
  _func_int *local_248;
  uint64_t uStack_240;
  TreeModel *pTStack_238;
  UByteArray *local_228;
  UModelIndex *local_220;
  CBString local_218;
  size_type local_1f8;
  ulong local_1f0;
  ulong local_1e8;
  UINT32 local_1dc;
  UModelIndex partitionIndex;
  CBString info;
  CBString name;
  CBString name_1;
  CBString text;
  CBString info_1;
  CBString local_130;
  CBString local_118;
  CBString local_100;
  CBString local_e8;
  UByteArray header;
  CBString local_b0;
  CBString local_98;
  CBString local_80;
  CBString local_68;
  UByteArray body;
  
  local_1f8 = (region->d)._M_string_length;
  local_1dc = sbpdtOffsetFixup;
  if ((uint)local_1f8 < 0x18) {
    usprintf((CBString *)local_258,"%s: BPDT region too small to fit BPDT partition table header",
             "parseBpdtRegion");
    msg(this,(CBString *)local_258,parent);
  }
  else {
    pcVar3 = (region->d)._M_dataplus._M_p;
    uVar15 = (uint)*(ushort *)(pcVar3 + 4) * 0xc;
    uVar14 = uVar15 + 0x18;
    if (uVar14 <= (uint)local_1f8) {
      local_220 = parent;
      UByteArray::left(&header,region,0x18);
      local_228 = region;
      UByteArray::mid(&body,region,0x18,uVar15);
      Bstrlib::CBString::CBString(&name,"BPDT partition table");
      local_1e8 = (ulong)*(ushort *)(pcVar3 + 4);
      local_1f0 = (ulong)(byte)pcVar3[6];
      usprintf(&info,
               "Full size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\nNumber of entries: %u\nVersion: %02Xh\nRedundancyFlag: %Xh\nIFWI version: %Xh\nFITC version: %u.%u.%u.%u"
               ,(ulong)uVar14,(ulong)uVar14,(ulong)(uint)header.d._M_string_length,
               (ulong)(uint)header.d._M_string_length,(ulong)uVar15,(ulong)uVar15,local_1e8,
               local_1f0,(ulong)(byte)pcVar3[7],(ulong)*(uint *)(pcVar3 + 0xc),
               (ulong)*(ushort *)(pcVar3 + 0x10),(ulong)*(ushort *)(pcVar3 + 0x12),
               (ulong)*(ushort *)(pcVar3 + 0x14),(ulong)*(ushort *)(pcVar3 + 0x16));
      pTVar4 = this->model;
      Bstrlib::CBString::CBString((CBString *)&signature);
      local_258._0_8_ = &local_248;
      local_258._8_8_ = 0;
      local_248 = (_func_int *)((ulong)local_248 & 0xffffffffffffff00);
      TreeModel::addItem((UModelIndex *)&partition,pTVar4,localOffset,'\\','\0',&name,
                         (CBString *)&signature,&info,&header,&body,(UByteArray *)local_258,Fixed,
                         local_220,'\0');
      uVar6 = local_1f8 & 0xffffffff;
      index->m = (TreeModel *)partition.d.field_2._M_allocated_capacity;
      *(pointer *)index = partition.d._M_dataplus._M_p;
      index->i = CONCAT44(partition.d._M_string_length._4_4_,(uint)partition.d._M_string_length);
      std::__cxx11::string::~string((string *)local_258);
      Bstrlib::CBString::~CBString((CBString *)&signature);
      partitions.super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      partitions.super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      partitions.super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uVar12 = (ulong)*(ushort *)(pcVar3 + 4);
      local_1f0 = (ulong)localOffset;
      lVar11 = 0x18;
      while( true ) {
        if (uVar12 == 0) break;
        bpdtEntryTypeToUString((CBString *)local_258,*(UINT16 *)(pcVar3 + lVar11));
        Bstrlib::CBString::operator=(&name,(CBString *)local_258);
        Bstrlib::CBString::~CBString((CBString *)local_258);
        usprintf((CBString *)&partitionIndex,
                 "Full size: %Xh (%u)\nType: %Xh\nPartition offset: %Xh\nPartition length: %Xh",0xc,
                 0xc,(ulong)*(ushort *)(pcVar3 + lVar11),(ulong)*(uint *)(pcVar3 + lVar11 + 4),
                 (ulong)*(uint *)(pcVar3 + lVar11 + 8));
        Bstrlib::CBString::CBString(&local_100,"\nSplit sub-partition first part: ");
        Bstrlib::CBString::operator+(&text,(CBString *)&partitionIndex,&local_100);
        bytes = (uint *)(pcVar3 + lVar11);
        pcVar9 = "Yes";
        if ((*bytes >> 0x10 & 1) == 0) {
          pcVar9 = "No";
        }
        Bstrlib::CBString::operator+(&info_1,&text,pcVar9);
        Bstrlib::CBString::CBString(&local_118,"\nSplit sub-partition second part: ");
        Bstrlib::CBString::operator+(&name_1,&info_1,&local_118);
        pcVar9 = "Yes";
        if ((*bytes >> 0x11 & 1) == 0) {
          pcVar9 = "No";
        }
        Bstrlib::CBString::operator+(&local_218,&name_1,pcVar9);
        Bstrlib::CBString::CBString(&local_e8,"\nCode sub-partition: ");
        Bstrlib::CBString::operator+((CBString *)&entryIndex,&local_218,&local_e8);
        pcVar9 = "Yes";
        if ((*bytes >> 0x12 & 1) == 0) {
          pcVar9 = "No";
        }
        Bstrlib::CBString::operator+((CBString *)&signature,(CBString *)&entryIndex,pcVar9);
        Bstrlib::CBString::CBString(&local_130,"\nUMA cacheable: ");
        Bstrlib::CBString::operator+((CBString *)&partition,(CBString *)&signature,&local_130);
        pcVar9 = "Yes";
        if ((*bytes >> 0x13 & 1) == 0) {
          pcVar9 = "No";
        }
        Bstrlib::CBString::operator+((CBString *)local_258,(CBString *)&partition,pcVar9);
        Bstrlib::CBString::operator=(&info,(CBString *)local_258);
        local_1e8 = uVar12 - 1;
        Bstrlib::CBString::~CBString((CBString *)local_258);
        Bstrlib::CBString::~CBString((CBString *)&partition);
        Bstrlib::CBString::~CBString(&local_130);
        Bstrlib::CBString::~CBString((CBString *)&signature);
        Bstrlib::CBString::~CBString((CBString *)&entryIndex);
        Bstrlib::CBString::~CBString(&local_e8);
        Bstrlib::CBString::~CBString(&local_218);
        Bstrlib::CBString::~CBString(&name_1);
        Bstrlib::CBString::~CBString(&local_118);
        Bstrlib::CBString::~CBString(&info_1);
        Bstrlib::CBString::~CBString(&text);
        Bstrlib::CBString::~CBString(&local_100);
        Bstrlib::CBString::~CBString((CBString *)&partitionIndex);
        pTVar4 = this->model;
        Bstrlib::CBString::CBString(&local_218);
        local_258._0_8_ = &local_248;
        local_258._8_8_ = 0;
        local_248 = (_func_int *)((ulong)local_248 & 0xffffffffffffff00);
        UByteArray::UByteArray(&partition,(char *)bytes,0xc);
        signature.d._M_dataplus._M_p = (pointer)&signature.d.field_2;
        signature.d._M_string_length = 0;
        signature.d.field_2._M_local_buf[0] = '\0';
        TreeModel::addItem(&entryIndex,pTVar4,(int)local_1f0 + (int)lVar11,']','\0',&name,&local_218
                           ,&info,(UByteArray *)local_258,&partition,&signature,Fixed,index,'\0');
        std::__cxx11::string::~string((string *)&signature);
        std::__cxx11::string::~string((string *)&partition);
        std::__cxx11::string::~string((string *)local_258);
        Bstrlib::CBString::~CBString(&local_218);
        uVar12 = local_1e8;
        if ((1 < *(int *)(pcVar3 + lVar11 + 4) + 1U) && (*(int *)(pcVar3 + lVar11 + 8) != 0)) {
          local_258[0xc] = 0x5e;
          local_258._8_4_ = bytes[2];
          local_258._13_3_ = 0;
          local_258._4_4_ = (undefined4)((ulong)*(undefined8 *)bytes >> 0x20);
          local_258._0_4_ = (undefined4)*(undefined8 *)bytes;
          local_258._4_4_ = local_258._4_4_ - local_1dc;
          pTStack_238 = entryIndex.m;
          local_248 = (_func_int *)entryIndex._0_8_;
          uStack_240 = entryIndex.i;
          std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::push_back
                    (&partitions,(value_type *)local_258);
        }
        lVar11 = lVar11 + 0xc;
      }
      if (partitions.super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          partitions.super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_248 = (_func_int *)0xffffffffffffffff;
        uStack_240 = 0;
        pTStack_238 = (TreeModel *)0x0;
        local_258._0_8_ = lVar11 << 0x20;
        local_258[0xc] = 0x40;
        local_258._8_4_ = (int)(local_228->d)._M_string_length - (int)lVar11;
        local_258._13_3_ = 0;
        std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::push_back
                  (&partitions,(value_type *)local_258);
      }
      do {
        if (partitions.
            super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>._M_impl.
            super__Vector_impl_data._M_start ==
            partitions.
            super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          UVar10 = 0xfd;
LAB_001165cd:
          std::_Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::
          ~_Vector_base(&partitions.
                         super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                       );
          Bstrlib::CBString::~CBString(&info);
          Bstrlib::CBString::~CBString(&name);
          std::__cxx11::string::~string((string *)&body);
          std::__cxx11::string::~string((string *)&header);
          return UVar10;
        }
        std::
        __sort<__gnu_cxx::__normal_iterator<BPDT_PARTITION_INFO_*,std::vector<BPDT_PARTITION_INFO_,std::allocator<BPDT_PARTITION_INFO_>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (partitions.
                   super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   partitions.
                   super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
        local_258._0_8_ = (_func_int **)0x0;
        local_258._8_8_ = 0;
        local_248 = (_func_int *)0xffffffffffffffff;
        uStack_240 = 0;
        pTStack_238 = (TreeModel *)0x0;
        uVar15 = ((partitions.
                   super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
                   _M_impl.super__Vector_impl_data._M_start)->ptEntry).Offset;
        if (uVar15 < uVar14) {
          usprintf((CBString *)&partition,
                   "%s: BPDT partition has intersection with BPDT partition table, skipped",
                   "parseBpdtRegion");
          msg(this,(CBString *)&partition,
              &(partitions.
                super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
                _M_impl.super__Vector_impl_data._M_start)->index);
          Bstrlib::CBString::~CBString((CBString *)&partition);
          pBVar13 = partitions.
                    super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
                    _M_impl.super__Vector_impl_data._M_start + 1;
          if (pBVar13 !=
              partitions.
              super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            memmove(partitions.
                    super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
                    _M_impl.super__Vector_impl_data._M_start,pBVar13,
                    (long)partitions.
                          super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar13);
          }
        }
        else {
          if (uVar14 < uVar15) {
            local_258._0_8_ = (ulong)uVar14 << 0x20;
            local_258[0xc] = 0x40;
            local_258._8_4_ =
                 ((partitions.
                   super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
                   _M_impl.super__Vector_impl_data._M_start)->ptEntry).Offset - uVar14;
            local_258._13_3_ = 0;
            std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::insert
                      (&partitions,
                       (const_iterator)
                       partitions.
                       super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                       ._M_impl.super__Vector_impl_data._M_start,(value_type *)local_258);
          }
          lVar11 = 0;
          uVar12 = 1;
          while( true ) {
            if ((ulong)(((long)partitions.
                               super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)partitions.
                              super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x28) <= uVar12) {
              lVar11 = 0;
              for (uVar12 = 0;
                  uVar12 < (ulong)(((long)partitions.
                                          super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)partitions.
                                         super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) / 0x28);
                  uVar12 = uVar12 + 1) {
                if ((&(partitions.
                       super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->type)[lVar11] == '@') {
                  UByteArray::mid(&partition,local_228,
                                  *(int32_t *)
                                   ((long)&((partitions.
                                             super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->ptEntry).
                                           Offset + lVar11),
                                  *(int32_t *)
                                   ((long)&((partitions.
                                             super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->ptEntry).
                                           Size + lVar11));
                  Bstrlib::CBString::CBString((CBString *)&signature,"Padding");
                  Bstrlib::CBString::operator=(&name,(CBString *)&signature);
                  Bstrlib::CBString::~CBString((CBString *)&signature);
                  usprintf((CBString *)&signature,"Full size: %Xh (%u)",
                           (ulong)(uint)partition.d._M_string_length);
                  Bstrlib::CBString::operator=(&info,(CBString *)&signature);
                  Bstrlib::CBString::~CBString((CBString *)&signature);
                  pTVar4 = this->model;
                  iVar8 = *(int *)((long)&((partitions.
                                            super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->ptEntry).
                                          Offset + lVar11);
                  UVar5 = getPaddingType(&partition);
                  Bstrlib::CBString::CBString(&local_218);
                  signature.d._M_dataplus._M_p = (pointer)&signature.d.field_2;
                  signature.d._M_string_length = 0;
                  signature.d.field_2._M_local_buf[0] = '\0';
                  entryIndex._0_8_ = &entryIndex.m;
                  entryIndex.i = 0;
                  entryIndex.m = (TreeModel *)((ulong)entryIndex.m & 0xffffffffffffff00);
                  TreeModel::addItem((UModelIndex *)&name_1,pTVar4,iVar8 + localOffset,'@',UVar5,
                                     &name,&local_218,&info,&signature,&partition,
                                     (UByteArray *)&entryIndex,Fixed,local_220,'\0');
                  std::__cxx11::string::~string((string *)&entryIndex);
                  std::__cxx11::string::~string((string *)&signature);
                  Bstrlib::CBString::~CBString(&local_218);
                  std::__cxx11::string::~string((string *)&partition);
                }
                else if ((&(partitions.
                            super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->type)[lVar11] == '^') {
                  bpdtEntryTypeToUString
                            (&name_1,*(UINT16 *)
                                      (&((partitions.
                                          super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->ptEntry).
                                        field_0x0 + lVar11));
                  UByteArray::mid(&partition,local_228,
                                  *(int32_t *)
                                   ((long)&((partitions.
                                             super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->ptEntry).
                                           Offset + lVar11),
                                  *(int32_t *)
                                   ((long)&((partitions.
                                             super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->ptEntry).
                                           Size + lVar11));
                  UByteArray::left(&signature,&partition,4);
                  usprintf(&local_130,"Full size: %Xh (%u)\nType: %Xh",
                           (ulong)(uint)partition.d._M_string_length);
                  Bstrlib::CBString::CBString(&local_68,"\nSplit sub-partition first part: ");
                  Bstrlib::CBString::operator+(&local_e8,&local_130,&local_68);
                  pcVar9 = "Yes";
                  if ((*(uint *)(&((partitions.
                                    super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->ptEntry).field_0x0 +
                                lVar11) >> 0x10 & 1) == 0) {
                    pcVar9 = "No";
                  }
                  Bstrlib::CBString::operator+(&local_118,&local_e8,pcVar9);
                  Bstrlib::CBString::CBString(&local_80,"\nSplit sub-partition second part: ");
                  Bstrlib::CBString::operator+(&local_100,&local_118,&local_80);
                  pcVar9 = "Yes";
                  if ((*(uint *)(&((partitions.
                                    super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->ptEntry).field_0x0 +
                                lVar11) >> 0x11 & 1) == 0) {
                    pcVar9 = "No";
                  }
                  Bstrlib::CBString::operator+((CBString *)&partitionIndex,&local_100,pcVar9);
                  Bstrlib::CBString::CBString(&local_98,"\nCode sub-partition: ");
                  Bstrlib::CBString::operator+(&text,(CBString *)&partitionIndex,&local_98);
                  pcVar9 = "Yes";
                  if ((*(uint *)(&((partitions.
                                    super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->ptEntry).field_0x0 +
                                lVar11) >> 0x12 & 1) == 0) {
                    pcVar9 = "No";
                  }
                  Bstrlib::CBString::operator+(&local_218,&text,pcVar9);
                  Bstrlib::CBString::CBString(&local_b0,"\nUMA cacheable: ");
                  Bstrlib::CBString::operator+((CBString *)&entryIndex,&local_218,&local_b0);
                  pcVar9 = "Yes";
                  if ((*(uint *)(&((partitions.
                                    super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->ptEntry).field_0x0 +
                                lVar11) >> 0x13 & 1) == 0) {
                    pcVar9 = "No";
                  }
                  Bstrlib::CBString::operator+(&info_1,(CBString *)&entryIndex,pcVar9);
                  Bstrlib::CBString::~CBString((CBString *)&entryIndex);
                  Bstrlib::CBString::~CBString(&local_b0);
                  Bstrlib::CBString::~CBString(&local_218);
                  Bstrlib::CBString::~CBString(&text);
                  Bstrlib::CBString::~CBString(&local_98);
                  Bstrlib::CBString::~CBString((CBString *)&partitionIndex);
                  Bstrlib::CBString::~CBString(&local_100);
                  Bstrlib::CBString::~CBString(&local_80);
                  Bstrlib::CBString::~CBString(&local_118);
                  Bstrlib::CBString::~CBString(&local_e8);
                  Bstrlib::CBString::~CBString(&local_68);
                  Bstrlib::CBString::~CBString(&local_130);
                  bpdtEntryTypeToUString
                            (&text,*(UINT16 *)
                                    (&((partitions.
                                        super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->ptEntry).
                                      field_0x0 + lVar11));
                  entryIndex._0_8_ = &entryIndex.m;
                  entryIndex.i = 0;
                  entryIndex.m = (TreeModel *)((ulong)entryIndex.m & 0xffffffffffffff00);
                  local_218._vptr_CBString = (_func_int **)&local_218.super_tagbstring.data;
                  local_218.super_tagbstring.mlen = 0;
                  local_218.super_tagbstring.slen = 0;
                  local_218.super_tagbstring.data._0_1_ = 0;
                  TreeModel::addItem(&partitionIndex,this->model,
                                     *(int *)((long)&((partitions.
                                                                                                              
                                                  super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  ptEntry).Offset + lVar11) + localOffset,'^','\0',
                                     &name_1,&text,&info_1,(UByteArray *)&entryIndex,&partition,
                                     (UByteArray *)&local_218,Fixed,local_220,'\0');
                  std::__cxx11::string::~string((string *)&local_218);
                  std::__cxx11::string::~string((string *)&entryIndex);
                  if (*(short *)(&((partitions.
                                    super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->ptEntry).field_0x0 +
                                lVar11) == 5) {
                    entryIndex.r = -1;
                    entryIndex.c = -1;
                    entryIndex.i = 0;
                    entryIndex.m = (TreeModel *)0x0;
                    parseBpdtRegion(this,&partition,0,
                                    *(UINT32 *)
                                     ((long)&((partitions.
                                               super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->ptEntry).
                                             Offset + lVar11),&partitionIndex,&entryIndex);
                  }
                  if (*(int *)partition.d._M_dataplus._M_p == 0x44504324) {
                    entryIndex.r = -1;
                    entryIndex.c = -1;
                    entryIndex.i = 0;
                    entryIndex.m = (TreeModel *)0x0;
                    parseCpdRegion(this,&partition,0,&partitionIndex,&entryIndex);
                  }
                  if (0x2d < (*(uint *)(&((partitions.
                                           super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->ptEntry).
                                         field_0x0 + lVar11) & 0xfffe)) {
                    usprintf((CBString *)&entryIndex,"%s: BPDT entry of unknown type found",
                             "parseBpdtRegion");
                    msg(this,(CBString *)&entryIndex,&partitionIndex);
                    Bstrlib::CBString::~CBString((CBString *)&entryIndex);
                  }
                  Bstrlib::CBString::~CBString(&text);
                  Bstrlib::CBString::~CBString(&info_1);
                  std::__cxx11::string::~string((string *)&signature);
                  std::__cxx11::string::~string((string *)&partition);
                  Bstrlib::CBString::~CBString(&name_1);
                }
                lVar11 = lVar11 + 0x28;
              }
              uVar14 = partitions.
                       super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1].ptEntry.Offset;
              uVar15 = partitions.
                       super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1].ptEntry.Size;
              if ((ulong)uVar15 + (ulong)uVar14 < uVar6) {
                iVar8 = uVar15 + uVar14;
                UByteArray::mid(&partition,local_228,iVar8,(int)local_1f8 - iVar8);
                Bstrlib::CBString::CBString((CBString *)&signature,"Padding");
                Bstrlib::CBString::operator=(&name,(CBString *)&signature);
                Bstrlib::CBString::~CBString((CBString *)&signature);
                usprintf((CBString *)&signature,"Full size: %Xh (%u)",
                         (ulong)(uint)partition.d._M_string_length);
                Bstrlib::CBString::operator=(&info,(CBString *)&signature);
                Bstrlib::CBString::~CBString((CBString *)&signature);
                pTVar4 = this->model;
                UVar1 = partitions.
                        super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                        ._M_impl.super__Vector_impl_data._M_finish[-1].ptEntry.Offset;
                UVar2 = partitions.
                        super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                        ._M_impl.super__Vector_impl_data._M_finish[-1].ptEntry.Size;
                UVar5 = getPaddingType(&partition);
                Bstrlib::CBString::CBString(&local_218);
                signature.d._M_dataplus._M_p = (pointer)&signature.d.field_2;
                signature.d._M_string_length = 0;
                signature.d.field_2._M_local_buf[0] = '\0';
                entryIndex._0_8_ = &entryIndex.m;
                entryIndex.i = 0;
                entryIndex.m = (TreeModel *)((ulong)entryIndex.m & 0xffffffffffffff00);
                TreeModel::addItem((UModelIndex *)&name_1,pTVar4,localOffset + UVar1 + UVar2,'@',
                                   UVar5,&name,&local_218,&info,&signature,&partition,
                                   (UByteArray *)&entryIndex,Fixed,local_220,'\0');
                std::__cxx11::string::~string((string *)&entryIndex);
                std::__cxx11::string::~string((string *)&signature);
                Bstrlib::CBString::~CBString(&local_218);
                std::__cxx11::string::~string((string *)&partition);
              }
              UVar10 = 0;
              goto LAB_001165cd;
            }
            uVar15 = *(uint *)((long)&partitions.
                                      super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[1].ptEntry.Offset +
                              lVar11);
            uVar16 = *(int *)((long)&((partitions.
                                       super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->ptEntry).Size +
                             lVar11) +
                     *(int *)((long)&((partitions.
                                       super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->ptEntry).Offset +
                             lVar11);
            uVar7 = *(uint *)((long)&partitions.
                                     super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[1].ptEntry.Size +
                             lVar11);
            if (uVar6 < (ulong)uVar7 + (ulong)uVar15) {
              if ((ulong)(long)(int)(local_228->d)._M_string_length <= (ulong)uVar15) {
                usprintf((CBString *)&partition,
                         "%s: BPDT partition is located outside of the opened image, skipped",
                         "parseBpdtRegion");
                msg(this,(CBString *)&partition,
                    (UModelIndex *)
                    ((long)&partitions.
                            super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                            ._M_impl.super__Vector_impl_data._M_start[1].index.r + lVar11));
                goto LAB_00115e1d;
              }
              usprintf((CBString *)&partition,
                       "%s: BPDT partition can\'t fit into its region, truncated","parseBpdtRegion")
              ;
              msg(this,(CBString *)&partition,
                  (UModelIndex *)
                  ((long)&partitions.
                          super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].index.r + lVar11));
              Bstrlib::CBString::~CBString((CBString *)&partition);
              uVar15 = *(uint *)((long)&partitions.
                                        super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[1].ptEntry.Offset
                                + lVar11);
              uVar7 = (int)local_1f8 - uVar15;
              *(uint *)((long)&partitions.
                               super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                               ._M_impl.super__Vector_impl_data._M_start[1].ptEntry.Size + lVar11) =
                   uVar7;
            }
            if (uVar15 < uVar16) break;
            if (uVar16 < uVar15) {
              local_258._4_4_ = uVar16;
              local_258[0xc] = 0x40;
              local_258._8_4_ =
                   *(int *)((long)&partitions.
                                   super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[1].ptEntry.Offset +
                           lVar11) - uVar16;
              std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::insert
                        (&partitions,
                         (BPDT_PARTITION_INFO_ *)
                         (&partitions.
                           super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                           ._M_impl.super__Vector_impl_data._M_start[1].ptEntry.field_0x0 + lVar11),
                         (value_type *)local_258);
            }
            uVar12 = uVar12 + 1;
            lVar11 = lVar11 + 0x28;
          }
          if (uVar16 < uVar7 + uVar15) {
            usprintf((CBString *)&partition,
                     "%s: BPDT partition intersects with previous one, skipped","parseBpdtRegion");
            msg(this,(CBString *)&partition,
                (UModelIndex *)
                ((long)&partitions.
                        super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1].index.r + lVar11));
          }
          else {
            usprintf((CBString *)&partition,
                     "%s: BPDT partition is located inside another BPDT partition, skipped",
                     "parseBpdtRegion");
            msg(this,(CBString *)&partition,
                (UModelIndex *)
                ((long)&partitions.
                        super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1].index.r + lVar11));
          }
LAB_00115e1d:
          Bstrlib::CBString::~CBString((CBString *)&partition);
          pBVar13 = (pointer)(&partitions.
                               super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                               ._M_impl.super__Vector_impl_data._M_start[2].ptEntry.field_0x0 +
                             lVar11);
          if (pBVar13 !=
              partitions.
              super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            memmove(&partitions.
                     super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                     ._M_impl.super__Vector_impl_data._M_start[1].ptEntry.field_0x0 + lVar11,pBVar13
                    ,(long)partitions.
                           super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                           ._M_impl.super__Vector_impl_data._M_finish +
                     (-lVar11 -
                     (long)partitions.
                           super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                           ._M_impl.super__Vector_impl_data._M_start) + -0x50);
          }
        }
        partitions.super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             partitions.
             super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>._M_impl
             .super__Vector_impl_data._M_finish + -1;
      } while( true );
    }
    usprintf((CBString *)local_258,"%s: BPDT region too small to fit BPDT partition table",
             "parseBpdtRegion");
    msg(this,(CBString *)local_258,parent);
  }
  Bstrlib::CBString::~CBString((CBString *)local_258);
  return 0xfd;
}

Assistant:

USTATUS FfsParser::parseBpdtRegion(const UByteArray & region, const UINT32 localOffset, const UINT32 sbpdtOffsetFixup, const UModelIndex & parent, UModelIndex & index)
{
    UINT32 regionSize = (UINT32)region.size();
    
    // Check region size
    if (regionSize < sizeof(BPDT_HEADER)) {
        msg(usprintf("%s: BPDT region too small to fit BPDT partition table header", __FUNCTION__), parent);
        return U_INVALID_ME_PARTITION_TABLE;
    }
    
    // Populate partition table header
    const BPDT_HEADER* ptHeader = (const BPDT_HEADER*)(region.constData());
    
    // Check region size again
    UINT32 ptBodySize = ptHeader->NumEntries * sizeof(BPDT_ENTRY);
    UINT32 ptSize = sizeof(BPDT_HEADER) + ptBodySize;
    if (regionSize < ptSize) {
        msg(usprintf("%s: BPDT region too small to fit BPDT partition table", __FUNCTION__), parent);
        return U_INVALID_ME_PARTITION_TABLE;
    }
    
    // Get info
    UByteArray header = region.left(sizeof(BPDT_HEADER));
    UByteArray body = region.mid(sizeof(BPDT_HEADER), ptBodySize);
    
    UString name = UString("BPDT partition table");
    UString info = usprintf("Full size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\n"
                            "Number of entries: %u\nVersion: %02Xh\nRedundancyFlag: %Xh\n"
                            "IFWI version: %Xh\nFITC version: %u.%u.%u.%u",
                            ptSize, ptSize,
                            (UINT32)header.size(), (UINT32)header.size(),
                            ptBodySize, ptBodySize,
                            ptHeader->NumEntries,
                            ptHeader->HeaderVersion,
                            ptHeader->RedundancyFlag,
                            ptHeader->IfwiVersion,
                            ptHeader->FitcMajor, ptHeader->FitcMinor, ptHeader->FitcHotfix, ptHeader->FitcBuild);
    
    // Add tree item
    index = model->addItem(localOffset, Types::BpdtStore, 0, name, UString(), info, header, body, UByteArray(), Fixed, parent);
    
    // Adjust offset
    UINT32 offset = sizeof(BPDT_HEADER);
    
    // Add partition table entries
    std::vector<BPDT_PARTITION_INFO> partitions;
    const BPDT_ENTRY* firstPtEntry = (const BPDT_ENTRY*)((const UINT8*)ptHeader + sizeof(BPDT_HEADER));
    UINT16 numEntries = ptHeader->NumEntries;
    for (UINT16 i = 0; i < numEntries; i++) {
        // Populate entry header
        const BPDT_ENTRY* ptEntry = firstPtEntry + i;
        
        // Get info
        name = bpdtEntryTypeToUString(ptEntry->Type);
        info = usprintf("Full size: %Xh (%u)\nType: %Xh\nPartition offset: %Xh\nPartition length: %Xh",
                        (UINT32)sizeof(BPDT_ENTRY), (UINT32)sizeof(BPDT_ENTRY),
                        ptEntry->Type,
                        ptEntry->Offset,
                        ptEntry->Size) +
        UString("\nSplit sub-partition first part: ") + (ptEntry->SplitSubPartitionFirstPart ? "Yes" : "No") +
        UString("\nSplit sub-partition second part: ") + (ptEntry->SplitSubPartitionSecondPart ? "Yes" : "No") +
        UString("\nCode sub-partition: ") + (ptEntry->CodeSubPartition ? "Yes" : "No") +
        UString("\nUMA cacheable: ") + (ptEntry->UmaCacheable ? "Yes" : "No");
        
        // Add tree item
        UModelIndex entryIndex = model->addItem(localOffset + offset, Types::BpdtEntry, 0, name, UString(), info, UByteArray(), UByteArray((const char*)ptEntry, sizeof(BPDT_ENTRY)), UByteArray(), Fixed, index);
        
        // Adjust offset
        offset += sizeof(BPDT_ENTRY);
        
        if (ptEntry->Offset != 0 && ptEntry->Offset != 0xFFFFFFFF && ptEntry->Size != 0) {
            // Add to partitions vector
            BPDT_PARTITION_INFO partition = {};
            partition.type = Types::BpdtPartition;
            partition.ptEntry = *ptEntry;
            partition.ptEntry.Offset -= sbpdtOffsetFixup;
            partition.index = entryIndex;
            partitions.push_back(partition);
        }
    }
    
    // Check for empty set of partitions
    if (partitions.empty()) {
        // Add a single padding partition in this case
        BPDT_PARTITION_INFO padding = {};
        padding.ptEntry.Offset = offset;
        padding.ptEntry.Size = (UINT32)(region.size() - padding.ptEntry.Offset);
        padding.type = Types::Padding;
        partitions.push_back(padding);
    }
    
make_partition_table_consistent:
    if (partitions.empty()) {
        return U_INVALID_ME_PARTITION_TABLE;
    }
    // Sort partitions by offset
    std::sort(partitions.begin(), partitions.end());
    
    // Check for intersections and paddings between partitions
    BPDT_PARTITION_INFO padding = {};
    
    // Check intersection with the partition table header
    if (partitions.front().ptEntry.Offset < ptSize) {
        msg(usprintf("%s: BPDT partition has intersection with BPDT partition table, skipped", __FUNCTION__),
            partitions.front().index);
        partitions.erase(partitions.begin());
        goto make_partition_table_consistent;
    }
    // Check for padding between partition table and the first partition
    else if (partitions.front().ptEntry.Offset > ptSize) {
        padding.ptEntry.Offset = ptSize;
        padding.ptEntry.Size = partitions.front().ptEntry.Offset - padding.ptEntry.Offset;
        padding.type = Types::Padding;
        partitions.insert(partitions.begin(), padding);
    }
    // Check for intersections/paddings between partitions
    for (size_t i = 1; i < partitions.size(); i++) {
        UINT32 previousPartitionEnd = partitions[i - 1].ptEntry.Offset + partitions[i - 1].ptEntry.Size;
        
        // Check that partition is fully present in the image
        if ((UINT64)partitions[i].ptEntry.Offset + (UINT64)partitions[i].ptEntry.Size > regionSize) {
            if ((UINT64)partitions[i].ptEntry.Offset >= (UINT64)region.size()) {
                msg(usprintf("%s: BPDT partition is located outside of the opened image, skipped", __FUNCTION__), partitions[i].index);
                partitions.erase(partitions.begin() + i);
                goto make_partition_table_consistent;
            }
            else {
                msg(usprintf("%s: BPDT partition can't fit into its region, truncated", __FUNCTION__), partitions[i].index);
                partitions[i].ptEntry.Size = regionSize - (UINT32)partitions[i].ptEntry.Offset;
            }
        }
        
        // Check for intersection with previous partition
        if (partitions[i].ptEntry.Offset < previousPartitionEnd) {
            // Check if current partition is located inside previous one
            if (partitions[i].ptEntry.Offset + partitions[i].ptEntry.Size <= previousPartitionEnd) {
                msg(usprintf("%s: BPDT partition is located inside another BPDT partition, skipped", __FUNCTION__),
                    partitions[i].index);
                partitions.erase(partitions.begin() + i);
                goto make_partition_table_consistent;
            }
            else {
                msg(usprintf("%s: BPDT partition intersects with previous one, skipped", __FUNCTION__),
                    partitions[i].index);
                partitions.erase(partitions.begin() + i);
                goto make_partition_table_consistent;
            }
        }
        
        // Check for padding between current and previous partitions
        else if (partitions[i].ptEntry.Offset > previousPartitionEnd) {
            padding.ptEntry.Offset = previousPartitionEnd;
            padding.ptEntry.Size = partitions[i].ptEntry.Offset - previousPartitionEnd;
            padding.type = Types::Padding;
            std::vector<BPDT_PARTITION_INFO>::iterator iter = partitions.begin();
            std::advance(iter, i);
            partitions.insert(iter, padding);
        }
    }
    
    // Partition map is consistent
    for (size_t i = 0; i < partitions.size(); i++) {
        if (partitions[i].type == Types::BpdtPartition) {
            // Get info
            UString name = bpdtEntryTypeToUString(partitions[i].ptEntry.Type);
            UByteArray partition = region.mid(partitions[i].ptEntry.Offset, partitions[i].ptEntry.Size);
            UByteArray signature = partition.left(sizeof(UINT32));
            
            UString info = usprintf("Full size: %Xh (%u)\nType: %Xh",
                                    (UINT32)partition.size(), (UINT32)partition.size(),
                                    partitions[i].ptEntry.Type) +
            UString("\nSplit sub-partition first part: ") + (partitions[i].ptEntry.SplitSubPartitionFirstPart ? "Yes" : "No") +
            UString("\nSplit sub-partition second part: ") + (partitions[i].ptEntry.SplitSubPartitionSecondPart ? "Yes" : "No") +
            UString("\nCode sub-partition: ") + (partitions[i].ptEntry.CodeSubPartition ? "Yes" : "No") +
            UString("\nUMA cacheable: ") + (partitions[i].ptEntry.UmaCacheable ? "Yes" : "No");
            
            UString text = bpdtEntryTypeToUString(partitions[i].ptEntry.Type);
            
            // Add tree item
            UModelIndex partitionIndex = model->addItem(localOffset + partitions[i].ptEntry.Offset, Types::BpdtPartition, 0, name, text, info, UByteArray(), partition, UByteArray(), Fixed, parent);
            
            // Special case of S-BPDT
            if (partitions[i].ptEntry.Type == BPDT_ENTRY_TYPE_S_BPDT) {
                UModelIndex sbpdtIndex;
                parseBpdtRegion(partition, 0, partitions[i].ptEntry.Offset, partitionIndex, sbpdtIndex); // Third parameter is a fixup for S-BPDT offset entries, because they are calculated from the start of BIOS region
            }
            
            // Parse code partitions
            if (readUnaligned((const UINT32*)partition.constData()) == CPD_SIGNATURE) {
                // Parse code partition contents
                UModelIndex cpdIndex;
                parseCpdRegion(partition, 0, partitionIndex, cpdIndex);
            }
            
            // Check for entry type to be known
            if (partitions[i].ptEntry.Type > BPDT_ENTRY_TYPE_PSEP) {
                msg(usprintf("%s: BPDT entry of unknown type found", __FUNCTION__), partitionIndex);
            }
        }
        else if (partitions[i].type == Types::Padding) {
            UByteArray padding = region.mid(partitions[i].ptEntry.Offset, partitions[i].ptEntry.Size);
            
            // Get info
            name = UString("Padding");
            info = usprintf("Full size: %Xh (%u)",
                            (UINT32)padding.size(), (UINT32)padding.size());
            
            // Add tree item
            model->addItem(localOffset + partitions[i].ptEntry.Offset, Types::Padding, getPaddingType(padding), name, UString(), info, UByteArray(), padding, UByteArray(), Fixed, parent);
        }
    }
    
    // Add padding after the last region
    if ((UINT64)partitions.back().ptEntry.Offset + (UINT64)partitions.back().ptEntry.Size < regionSize) {
        UINT64 usedSize = (UINT64)partitions.back().ptEntry.Offset + (UINT64)partitions.back().ptEntry.Size;
        UByteArray padding = region.mid(partitions.back().ptEntry.Offset + partitions.back().ptEntry.Size, (int)(regionSize - usedSize));
        
        // Get info
        name = UString("Padding");
        info = usprintf("Full size: %Xh (%u)",
                        (UINT32)padding.size(), (UINT32)padding.size());
        
        // Add tree item
        model->addItem(localOffset + partitions.back().ptEntry.Offset + partitions.back().ptEntry.Size, Types::Padding, getPaddingType(padding), name, UString(), info, UByteArray(), padding, UByteArray(), Fixed, parent);
    }
    
    return U_SUCCESS;
}